

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_copy(mp_int *a,mp_int *b)

{
  int iVar1;
  mp_digit *pmVar2;
  int iVar3;
  mp_digit *pmVar4;
  int iVar5;
  long lVar6;
  
  if (a == b) {
    return 0;
  }
  iVar3 = a->used;
  if (b->alloc < iVar3) {
    iVar3 = mp_grow(b,iVar3);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = a->used;
  }
  pmVar2 = a->dp;
  pmVar4 = b->dp;
  lVar6 = 0;
  iVar5 = 0;
  if (0 < iVar3) {
    iVar5 = iVar3;
  }
  for (; iVar5 != (int)lVar6; lVar6 = lVar6 + 1) {
    *pmVar4 = pmVar2[lVar6];
    pmVar4 = pmVar4 + 1;
  }
  iVar1 = b->used;
  for (lVar6 = 0; iVar5 + (int)lVar6 < iVar1; lVar6 = lVar6 + 1) {
    pmVar4[lVar6] = 0;
  }
  b->used = iVar3;
  b->sign = a->sign;
  return 0;
}

Assistant:

int mp_copy (mp_int * a, mp_int * b)
{
  int     res, n;

  /* if dst == src do nothing */
  if (a == b) {
    return MP_OKAY;
  }

  /* grow dest */
  if (b->alloc < a->used) {
     if ((res = mp_grow (b, a->used)) != MP_OKAY) {
        return res;
     }
  }

  /* zero b and copy the parameters over */
  {
    register mp_digit *tmpa, *tmpb;

    /* pointer aliases */

    /* source */
    tmpa = a->dp;

    /* destination */
    tmpb = b->dp;

    /* copy all the digits */
    for (n = 0; n < a->used; n++) {
      *tmpb++ = *tmpa++;
    }

    /* clear high digits */
    for (; n < b->used; n++) {
      *tmpb++ = 0;
    }
  }

  /* copy used count and sign */
  b->used = a->used;
  b->sign = a->sign;
  return MP_OKAY;
}